

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O0

int co_accept(int fd,sockaddr *addr,socklen_t *len)

{
  int fd_00;
  uint uVar1;
  int iVar2;
  rpchook_t *prVar3;
  int ret;
  int flag;
  int current_flags;
  rpchook_t *lp;
  int cli;
  socklen_t *len_local;
  sockaddr *addr_local;
  int fd_local;
  
  if (g_sys_fcntl_func == (fcntl_pfn_t)0x0) {
    g_sys_fcntl_func = (fcntl_pfn_t)dlsym(0xffffffffffffffff,"fcntl");
  }
  fd_00 = accept(fd,(sockaddr *)addr,len);
  if (-1 < fd_00) {
    prVar3 = alloc_by_fd(fd_00);
    uVar1 = (*g_sys_fcntl_func)(fd_00,3,0);
    iVar2 = (*g_sys_fcntl_func)(fd_00,4,(ulong)(uVar1 | 0x800));
    if ((iVar2 == 0) && (prVar3 != (rpchook_t *)0x0)) {
      prVar3->user_flag = uVar1;
    }
  }
  return fd_00;
}

Assistant:

int co_accept( int fd, struct sockaddr *addr, socklen_t *len )
{
	HOOK_SYS_FUNC( fcntl );

	int cli = accept( fd,addr,len );
	if( cli < 0 )
	{
		return cli;
	}
	rpchook_t *lp = alloc_by_fd( cli );


	int	current_flags = g_sys_fcntl_func( cli ,F_GETFL, 0 );
	int flag = current_flags;
	flag |= O_NONBLOCK;

	int ret = g_sys_fcntl_func( cli ,F_SETFL, flag );
	if( 0 == ret && lp ){
		lp->user_flag = current_flags;
	}
	return cli;
}